

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

_Bool rf_supports_image_file_type(char *filename)

{
  _Bool _Var1;
  
  _Var1 = rf_is_file_extension(filename,".png");
  if (!_Var1) {
    _Var1 = rf_is_file_extension(filename,".bmp");
    if (!_Var1) {
      _Var1 = rf_is_file_extension(filename,".tga");
      if (!_Var1) {
        _Var1 = rf_is_file_extension(filename,".pic");
        if (!_Var1) {
          _Var1 = rf_is_file_extension(filename,".psd");
          if (!_Var1) {
            _Var1 = rf_is_file_extension(filename,".hdr");
            return _Var1;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

RF_API bool rf_supports_image_file_type(const char* filename)
{
    return       rf_is_file_extension(filename, ".png")
              || rf_is_file_extension(filename, ".bmp")
              || rf_is_file_extension(filename, ".tga")
              || rf_is_file_extension(filename, ".pic")
              || rf_is_file_extension(filename, ".psd")
              || rf_is_file_extension(filename, ".hdr");
}